

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void sendtftp(testcase *test,formats *pf)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  ssize_t n;
  int size;
  formats *pf_local;
  testcase *test_local;
  
  sendblock = 1;
  mysignal(0xe,timer);
  sdp = r_init();
  sap = (tftphdr *)&ackbuf;
LAB_00107f14:
  iVar2 = readit(test,&sdp,pf->f_convert);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    nak(*piVar3 + 100);
  }
  else {
    uVar1 = htons(3);
    sdp->th_opcode = uVar1;
    uVar1 = htons(sendblock);
    (sdp->th_u1).th_u2.th_u3.tu_block = uVar1;
    timeout = 0;
    __sigsetjmp(timeoutbuf,1);
    while (sVar4 = send(peer,sdp,(long)(iVar2 + 4),0x4000), sVar4 == iVar2 + 4) {
      read_ahead(test,pf->f_convert);
      do {
        do {
          alarm(rexmtval);
          sVar4 = recv(peer,&ackbuf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sVar4 < 0) {
            logmsg("read: fail");
            return;
          }
          uVar1 = ntohs(sap->th_opcode);
          sap->th_opcode = uVar1;
          uVar1 = ntohs((sap->th_u1).th_u2.th_u3.tu_block);
          (sap->th_u1).th_u2.th_u3.tu_block = uVar1;
          if (sap->th_opcode == 5) {
            logmsg("got ERROR");
            return;
          }
        } while (sap->th_opcode != 4);
        if ((sap->th_u1).th_u2.th_u3.tu_block == sendblock) {
          sendblock = sendblock + 1;
          if (iVar2 != 0x200) {
            return;
          }
          goto LAB_00107f14;
        }
        synchnet(peer);
      } while ((uint)(sap->th_u1).th_u2.th_u3.tu_block != sendblock - 1);
    }
    logmsg("write");
  }
  return;
}

Assistant:

static void sendtftp(struct testcase *test, struct formats *pf)
{
  int size;
  ssize_t n;
  sendblock = 1;
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  sdp = r_init();
  sap = &ackbuf.hdr;
  do {
    size = readit(test, &sdp, pf->f_convert);
    if (size < 0) {
      nak(ERRNO + 100);
      return;
    }
    sdp->th_opcode = htons((unsigned short)opcode_DATA);
    sdp->th_block = htons(sendblock);
    timeout = 0;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
    send_data:
    if (swrite(peer, sdp, size + 4) != size + 4) {
      logmsg("write");
      return;
    }
    read_ahead(test, pf->f_convert);
    for ( ; ; ) {
#ifdef HAVE_ALARM
      alarm(rexmtval);        /* read the ack */
#endif
      n = sread(peer, &ackbuf.storage[0], sizeof(ackbuf.storage));
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        return;
      if (n < 0) {
        logmsg("read: fail");
        return;
      }
      sap->th_opcode = ntohs((unsigned short)sap->th_opcode);
      sap->th_block = ntohs(sap->th_block);

      if (sap->th_opcode == opcode_ERROR) {
        logmsg("got ERROR");
        return;
      }

      if (sap->th_opcode == opcode_ACK) {
        if (sap->th_block == sendblock) {
          break;
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if (sap->th_block == (sendblock-1)) {
          goto send_data;
        }
      }

    }
    sendblock++;
  } while (size == SEGSIZE);
}